

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessauthenticationmanager.cpp
# Opt level: O1

void __thiscall
QNetworkAccessAuthenticationManager::cacheProxyCredentials
          (QNetworkAccessAuthenticationManager *this,QNetworkProxy *p,QAuthenticator *authenticator)

{
  QMutex *pQVar1;
  __pointer_type pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Data *pDVar5;
  QNetworkAuthenticationCache *this_00;
  int iVar6;
  long in_FS_OFFSET;
  bool bVar7;
  QNetworkProxy proxy;
  QString local_c8;
  QString local_b0;
  QString local_98;
  QString local_78;
  QNetworkProxy local_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = &this->mutex;
  if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar7 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar7) {
      (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar7) goto LAB_00175d05;
  }
  QBasicMutex::lockInternal();
LAB_00175d05:
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QAuthenticator::realm(&local_58,authenticator);
  local_60.d.d.ptr = (QSharedDataPointer<QNetworkProxyPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QNetworkProxy::QNetworkProxy(&local_60,p);
  QAuthenticator::user(&local_78,authenticator);
  QNetworkProxy::setUser(&local_60,&local_78);
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  QAuthenticator::password(&local_78,authenticator);
  pcVar3 = local_78.d.ptr;
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (pcVar3 != (char16_t *)0x0) {
    while( true ) {
      do {
        local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        proxyAuthenticationKey((QByteArray *)&local_78,&local_60,&local_58);
        if ((undefined1 *)local_78.d.size == (undefined1 *)0x0) {
          iVar6 = 1;
        }
        else {
          this_00 = (QNetworkAuthenticationCache *)operator_new(0x48);
          (this_00->super_QList<QNetworkAuthenticationCredential>).d.d = (Data *)0x0;
          (this_00->super_QList<QNetworkAuthenticationCredential>).d.ptr =
               (QNetworkAuthenticationCredential *)0x0;
          (this_00->super_QList<QNetworkAuthenticationCredential>).d.size = 0;
          QNetworkAccessCache::CacheableObject::CacheableObject
                    ((CacheableObject *)this_00,(Options)0x2);
          (this_00->super_CacheableObject)._vptr_CacheableObject =
               (_func_int **)&PTR__QNetworkAuthenticationCache_002cf428;
          QList<QNetworkAuthenticationCredential>::reserve
                    (&this_00->super_QList<QNetworkAuthenticationCredential>,1);
          local_98.d.size = 0;
          local_98.d.d = (Data *)0x0;
          local_98.d.ptr = (char16_t *)0x0;
          QAuthenticator::user(&local_b0,authenticator);
          QAuthenticator::password(&local_c8,authenticator);
          QNetworkAuthenticationCache::insert(this_00,&local_98,&local_b0,&local_c8);
          if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
            }
          }
          QNetworkAccessCache::addEntry
                    ((QNetworkAccessCache *)this,(QByteArray *)&local_78,(CacheableObject *)this_00,
                     -1);
          pDVar5 = local_58.d.d;
          if ((undefined1 *)local_58.d.size == (undefined1 *)0x0) {
            iVar6 = 4;
          }
          else {
            iVar6 = 0;
            if (local_58.d.ptr != (char16_t *)0x0) {
              local_58.d.d = (Data *)0x0;
              local_58.d.ptr = (char16_t *)0x0;
              local_58.d.size = 0;
              iVar6 = 0;
              if (&pDVar5->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
                UNLOCK();
                iVar6 = 0;
                if ((pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
                  QArrayData::deallocate(&pDVar5->super_QArrayData,2,0x10);
                }
              }
            }
          }
        }
        if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,1,0x10);
          }
        }
      } while (iVar6 == 0);
      if (iVar6 != 4) break;
      QNetworkProxy::user(&local_78,&local_60);
      qVar4 = local_78.d.size;
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
      if ((undefined1 *)qVar4 == (undefined1 *)0x0) break;
      local_78.d.d = (Data *)0x0;
      local_78.d.ptr = (char16_t *)0x0;
      local_78.d.size = 0;
      QNetworkProxy::setUser(&local_60,&local_78);
      if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
  }
  QNetworkProxy::~QNetworkProxy(&local_60);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  LOCK();
  pQVar2 = (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (pQVar1->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar2 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(pQVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkAccessAuthenticationManager::cacheProxyCredentials(const QNetworkProxy &p,
                                                  const QAuthenticator *authenticator)
{
    Q_ASSERT(authenticator);
    Q_ASSERT(p.type() != QNetworkProxy::DefaultProxy);
    Q_ASSERT(p.type() != QNetworkProxy::NoProxy);

    QMutexLocker mutexLocker(&mutex);

    QString realm = authenticator->realm();
    QNetworkProxy proxy = p;
    proxy.setUser(authenticator->user());

    // don't cache null passwords, empty password may be valid though
    if (authenticator->password().isNull())
        return;

    // Set two credentials: one with the username and one without
    do {
        // Set two credentials actually: one with and one without the realm
        do {
            QByteArray cacheKey = proxyAuthenticationKey(proxy, realm);
            if (cacheKey.isEmpty())
                return;             // should not happen

            QNetworkAuthenticationCache *auth = new QNetworkAuthenticationCache;
            auth->insert(QString(), authenticator->user(), authenticator->password());
            authenticationCache.addEntry(cacheKey, auth); // replace the existing one, if there's any

            if (realm.isEmpty()) {
                break;
            } else {
                realm.clear();
            }
        } while (true);

        if (proxy.user().isEmpty())
            break;
        else
            proxy.setUser(QString());
    } while (true);
}